

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void container_suite::test_assoc_array(void)

{
  value local_64;
  value_type input [2];
  undefined4 local_5c;
  decoder decoder;
  
  input[0] = 0x9e;
  input[1] = 0x9f;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[2]>(&decoder,&input);
  local_64 = decoder.current.code;
  local_5c = 0x9e;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::begin_assoc_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x3fb,"void container_suite::test_assoc_array()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::token::symbol::convert(decoder.current.code);
  local_5c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::begin_assoc_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x3fc,"void container_suite::test_assoc_array()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::detail::decoder::category(&decoder);
  local_5c = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::structural",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x3fd,"void container_suite::test_assoc_array()",&local_64,&local_5c);
  trial::protocol::bintoken::detail::decoder::next(&decoder);
  local_64 = decoder.current.code;
  local_5c = 0x9f;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end_assoc_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x3ff,"void container_suite::test_assoc_array()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::token::symbol::convert(decoder.current.code);
  local_5c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::end_assoc_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x400,"void container_suite::test_assoc_array()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::detail::decoder::category(&decoder);
  local_5c = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::structural",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x401,"void container_suite::test_assoc_array()",&local_64,&local_5c);
  trial::protocol::bintoken::detail::decoder::next(&decoder);
  local_64 = decoder.current.code;
  local_5c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x403,"void container_suite::test_assoc_array()",&local_64,&local_5c);
  return;
}

Assistant:

void test_assoc_array()
{
    const value_type input[] = { token::code::begin_assoc_array, token::code::end_assoc_array };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::begin_assoc_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::begin_assoc_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::structural);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end_assoc_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::end_assoc_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::structural);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}